

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JtagAnalyzer.cpp
# Opt level: O0

void __thiscall JtagAnalyzer::WorkerThread(JtagAnalyzer *this)

{
  bool bVar1;
  int iVar2;
  MarkerType MVar3;
  JtagTAPState JVar4;
  BitState tms_state;
  U64 UVar5;
  element_type *peVar6;
  long lVar7;
  value_type local_8a;
  value_type local_89;
  size_type local_88;
  size_t bitCount;
  JtagShiftedData shifted_data;
  size_t local_38;
  Frame frm;
  JtagAnalyzer *this_local;
  
  Setup(this);
  if ((this->mTrst == (AnalyzerChannelData *)0x0) ||
     (iVar2 = AnalyzerChannelData::GetBitState(), iVar2 != 0)) {
    JtagTAP_Controller::SetState(&this->mTAPCtrl,(this->mSettings).mTAPInitialState);
  }
  else {
    JtagTAP_Controller::SetState(&this->mTAPCtrl,TestLogicReset);
    AnalyzerChannelData::AdvanceToNextEdge();
    UVar5 = AnalyzerChannelData::GetSampleNumber();
    SyncToSample(this,UVar5);
  }
  Frame::Frame((Frame *)&local_38);
  local_38 = AnalyzerChannelData::GetSampleNumber();
  JtagTAP_Controller::GetCurrState(&this->mTAPCtrl);
  JtagShiftedData::JtagShiftedData((JtagShiftedData *)&bitCount);
  do {
    AdvanceTck(this,(Frame *)&local_38,(JtagShiftedData *)&bitCount);
    iVar2 = AnalyzerChannelData::GetBitState();
    if (iVar2 == 0) {
      AdvanceTck(this,(Frame *)&local_38,(JtagShiftedData *)&bitCount);
    }
    UVar5 = AnalyzerChannelData::GetSampleNumber();
    SyncToSample(this,UVar5);
    peVar6 = std::auto_ptr<JtagAnalyzerResults>::operator->(&this->mResults);
    MVar3 = AnalyzerChannelData::GetSampleNumber();
    AnalyzerResults::AddMarker((ulonglong)peVar6,MVar3,(Channel *)0x4);
    JVar4 = JtagTAP_Controller::GetCurrState(&this->mTAPCtrl);
    if ((JVar4 == ShiftIR) ||
       (JVar4 = JtagTAP_Controller::GetCurrState(&this->mTAPCtrl), JVar4 == ShiftDR)) {
      local_88 = 0;
      if (this->mTdi != (AnalyzerChannelData *)0x0) {
        peVar6 = std::auto_ptr<JtagAnalyzerResults>::operator->(&this->mResults);
        MVar3 = AnalyzerChannelData::GetSampleNumber();
        iVar2 = AnalyzerChannelData::GetBitState();
        AnalyzerResults::AddMarker((ulonglong)peVar6,MVar3,(Channel *)(ulong)(iVar2 == 1 ^ 0xb));
        local_89 = AnalyzerChannelData::GetBitState();
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&shifted_data,&local_89)
        ;
        local_88 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&shifted_data
                             );
      }
      if (this->mTdo != (AnalyzerChannelData *)0x0) {
        peVar6 = std::auto_ptr<JtagAnalyzerResults>::operator->(&this->mResults);
        MVar3 = AnalyzerChannelData::GetSampleNumber();
        iVar2 = AnalyzerChannelData::GetBitState();
        AnalyzerResults::AddMarker((ulonglong)peVar6,MVar3,(Channel *)(ulong)(iVar2 == 1 ^ 0xb));
        local_8a = AnalyzerChannelData::GetBitState();
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   &shifted_data.mTdiBits.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,&local_8a);
        local_88 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                              &shifted_data.mTdiBits.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      if (((this->mSettings).mShiftDRBitsPerDataUnit != 0) &&
         ((this->mSettings).mShiftDRBitsPerDataUnit <= local_88)) {
        UVar5 = AnalyzerChannelData::GetSampleNumber();
        CloseFrameV2(this,(Frame *)&local_38,(JtagShiftedData *)&bitCount,UVar5);
        lVar7 = AnalyzerChannelData::GetSampleNumber();
        local_38 = lVar7 + 1;
        JtagTAP_Controller::GetCurrState(&this->mTAPCtrl);
        bitCount = local_38;
        std::auto_ptr<JtagAnalyzerResults>::operator->(&this->mResults);
        AnalyzerResults::CommitResults();
      }
    }
    tms_state = AnalyzerChannelData::GetBitState();
    bVar1 = JtagTAP_Controller::AdvanceState(&this->mTAPCtrl,tms_state);
    if (bVar1) {
      peVar6 = std::auto_ptr<JtagAnalyzerResults>::operator->(&this->mResults);
      MVar3 = AnalyzerChannelData::GetSampleNumber();
      AnalyzerResults::AddMarker((ulonglong)peVar6,MVar3,(Channel *)0x0);
      UVar5 = AnalyzerChannelData::GetSampleNumber();
      CloseFrameV2(this,(Frame *)&local_38,(JtagShiftedData *)&bitCount,UVar5);
      lVar7 = AnalyzerChannelData::GetSampleNumber();
      local_38 = lVar7 + 1;
      JtagTAP_Controller::GetCurrState(&this->mTAPCtrl);
      bitCount = local_38;
      std::auto_ptr<JtagAnalyzerResults>::operator->(&this->mResults);
      AnalyzerResults::CommitResults();
    }
    AnalyzerChannelData::GetSampleNumber();
    Analyzer::ReportProgress((ulonglong)this);
  } while( true );
}

Assistant:

void JtagAnalyzer::WorkerThread()
{
    Setup();

    // make sure that we enter the loop on TRST high (inactive)
    if( mTrst != NULL && mTrst->GetBitState() == BIT_LOW )
    {
        // since we started on a active TRST we'll
        // ignore the initial state from the settings
        mTAPCtrl.SetState( TestLogicReset );

        // advance to the rising edge of TRST
        mTrst->AdvanceToNextEdge();
        SyncToSample( mTrst->GetSampleNumber() );
    }
    else
    {
        mTAPCtrl.SetState( mSettings.mTAPInitialState );
    }

    Frame frm;
    frm.mStartingSampleInclusive = mTck->GetSampleNumber();
    frm.mType = mTAPCtrl.GetCurrState();
    frm.mFlags = 0;
    frm.mData1 = 0;
    frm.mData2 = 0;

    JtagShiftedData shifted_data;

    for( ;; )
    {
        // advance TCK to the rising edge
        AdvanceTck( frm, shifted_data );
        if( mTck->GetBitState() == BIT_LOW )
            AdvanceTck( frm, shifted_data );

        // advance all other channels here too
        SyncToSample( mTck->GetSampleNumber() );

        // mark the rising edge of TCK
        mResults->AddMarker( mTck->GetSampleNumber(), AnalyzerResults::UpArrow, mSettings.mTckChannel );

        // save TDI and TDO states markers and data
        if( mTAPCtrl.GetCurrState() == ShiftIR || mTAPCtrl.GetCurrState() == ShiftDR )
        {
            size_t bitCount = 0;

            if( mTdi != NULL )
            {
                mResults->AddMarker( mTdi->GetSampleNumber(),
                                     ( mTdi->GetBitState() == BIT_HIGH ? AnalyzerResults::One : AnalyzerResults::Zero ),
                                     mSettings.mTdiChannel );
                shifted_data.mTdiBits.push_back( mTdi->GetBitState() );
                bitCount = shifted_data.mTdiBits.size();
            }

            if( mTdo != NULL )
            {
                mResults->AddMarker( mTdo->GetSampleNumber(),
                                     ( mTdo->GetBitState() == BIT_HIGH ? AnalyzerResults::One : AnalyzerResults::Zero ),
                                     mSettings.mTdoChannel );
                shifted_data.mTdoBits.push_back( mTdo->GetBitState() );
                bitCount = shifted_data.mTdoBits.size();
            }

            if( ( mSettings.mShiftDRBitsPerDataUnit != 0 ) && ( bitCount >= mSettings.mShiftDRBitsPerDataUnit ) )
            {
                CloseFrameV2( frm, shifted_data, mTck->GetSampleNumber() );

                // prepare the next frame
                frm.mStartingSampleInclusive = mTck->GetSampleNumber() + 1;
                frm.mType = mTAPCtrl.GetCurrState();

                shifted_data.mStartSampleIndex = frm.mStartingSampleInclusive;

                mResults->CommitResults();
            }
        }

        // send TMS state to the TAP state machine - returns true if state machine has changed
        if( mTAPCtrl.AdvanceState( mTms->GetBitState() ) )
        {
            mResults->AddMarker( mTms->GetSampleNumber(), AnalyzerResults::Dot, mSettings.mTmsChannel );

            CloseFrameV2( frm, shifted_data, mTck->GetSampleNumber() );

            // prepare the next frame
            frm.mStartingSampleInclusive = mTck->GetSampleNumber() + 1;
            frm.mType = mTAPCtrl.GetCurrState();

            shifted_data.mStartSampleIndex = frm.mStartingSampleInclusive;

            mResults->CommitResults();
        }

        // update progress bar
        ReportProgress( mTck->GetSampleNumber() );
    }
}